

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O2

void __thiscall
cppurses::detail::Event_queue::View<(cppurses::Event::Type)0>::Move_iterator::Move_iterator
          (Move_iterator *this,Event_queue *queue)

{
  _Rb_tree_header *p_Var1;
  Size_t SVar2;
  
  this->mtx_ = &queue->mtx_;
  (this->already_sent_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->already_sent_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->already_sent_)._M_t._M_impl.super__Rb_tree_header;
  (this->already_sent_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->already_sent_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->already_sent_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->events_ = &queue->general_events_;
  SVar2 = find_next(this,0xffffffffffffffff);
  this->at_ = SVar2;
  return;
}

Assistant:

Move_iterator(Event_queue& queue)
                : mtx_{queue.mtx_},
                  events_{get_events(queue)},
                  at_{this->find_next(static_cast<Size_t>(-1))}
            {}